

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O0

int archive_read_disk_entry_from_file(archive *_a,archive_entry *entry,int fd,stat *st)

{
  archive_entry *paVar1;
  int iVar2;
  int *piVar3;
  la_int64_t lVar4;
  size_t __size;
  char *__buf;
  ssize_t sVar5;
  int local_fc;
  int lnklen;
  char *linkbuffer;
  size_t linkbuffer_len;
  int stflags;
  int r1;
  int r;
  int initial_fd;
  stat s;
  char *name;
  char *path;
  archive_read_disk *a;
  stat *st_local;
  archive_entry *paStack_20;
  int fd_local;
  archive_entry *entry_local;
  archive *_a_local;
  
  r1 = fd;
  st_local._4_4_ = fd;
  paStack_20 = entry;
  entry_local = (archive_entry *)_a;
  archive_clear_error(_a);
  name = archive_entry_sourcepath(paStack_20);
  if (name == (char *)0x0) {
    name = archive_entry_pathname(paStack_20);
  }
  a = (archive_read_disk *)st;
  if (*(long *)&_a[1].archive_format == 0) {
    if (st == (stat *)0x0) {
      if (st_local._4_4_ < 0) {
        if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
          iVar2 = lstat(name,(stat *)&r);
          if (iVar2 != 0) {
            piVar3 = __errno_location();
            archive_set_error(_a,*piVar3,"Can\'t lstat %s",name);
            return -0x19;
          }
        }
        else {
          iVar2 = stat(name,(stat *)&r);
          if (iVar2 != 0) {
            piVar3 = __errno_location();
            archive_set_error(_a,*piVar3,"Can\'t stat %s",name);
            return -0x19;
          }
        }
      }
      else {
        iVar2 = fstat(st_local._4_4_,(stat *)&r);
        if (iVar2 != 0) {
          piVar3 = __errno_location();
          archive_set_error(_a,*piVar3,"Can\'t fstat");
          return -0x19;
        }
      }
      a = (archive_read_disk *)&r;
    }
    archive_entry_copy_stat(paStack_20,(stat *)a);
  }
  paVar1 = entry_local;
  lVar4 = archive_entry_uid(paStack_20);
  s.__glibc_reserved[2] = (__syscall_slong_t)archive_read_disk_uname((archive *)paVar1,lVar4);
  if ((char *)s.__glibc_reserved[2] != (char *)0x0) {
    archive_entry_copy_uname(paStack_20,(char *)s.__glibc_reserved[2]);
  }
  paVar1 = entry_local;
  lVar4 = archive_entry_gid(paStack_20);
  s.__glibc_reserved[2] = (__syscall_slong_t)archive_read_disk_gname((archive *)paVar1,lVar4);
  if ((char *)s.__glibc_reserved[2] != (char *)0x0) {
    archive_entry_copy_gname(paStack_20,(char *)s.__glibc_reserved[2]);
  }
  if (((_a[1].file_count & 0x40U) == 0) &&
     ((((ulong)(a->archive).archive_format_name & 0xf000) == 0x8000 ||
      (((ulong)(a->archive).archive_format_name & 0xf000) == 0x4000)))) {
    if (st_local._4_4_ < 0) {
      if (*(long *)&_a[1].archive_format == 0) {
        st_local._4_4_ = open(name,0x80800);
      }
      else {
        st_local._4_4_ =
             (*(code *)_a[1].archive_format_name)(*(undefined8 *)&_a[1].archive_format,name,0x80800)
        ;
      }
      __archive_ensure_cloexec_flag(st_local._4_4_);
    }
    if (((-1 < st_local._4_4_) &&
        (stflags = ioctl(st_local._4_4_,0x80086601,&linkbuffer_len), stflags == 0)) &&
       ((int)linkbuffer_len != 0)) {
      archive_entry_set_fflags(paStack_20,(long)(int)linkbuffer_len,0);
    }
  }
  if (((ulong)(a->archive).archive_format_name & 0xf000) == 0xa000) {
    __size = *(long *)&(a->archive).file_count + 1;
    __buf = (char *)malloc(__size);
    if (__buf == (char *)0x0) {
      archive_set_error(_a,0xc,"Couldn\'t read link data");
      return -0x19;
    }
    if (*(long *)&_a[1].archive_format == 0) {
      sVar5 = readlink(name,__buf,__size);
      local_fc = (int)sVar5;
    }
    else {
      iVar2 = (**(code **)&_a[1].compression_code)(*(undefined8 *)&_a[1].archive_format);
      sVar5 = readlinkat(iVar2,name,__buf,__size);
      local_fc = (int)sVar5;
    }
    if (local_fc < 0) {
      piVar3 = __errno_location();
      archive_set_error(_a,*piVar3,"Couldn\'t read link data");
      free(__buf);
      return -0x19;
    }
    __buf[local_fc] = '\0';
    archive_entry_set_symlink(paStack_20,__buf);
    free(__buf);
  }
  stflags = 0;
  if ((_a[1].file_count & 0x20U) == 0) {
    stflags = archive_read_disk_entry_setup_acls
                        ((archive_read_disk *)_a,paStack_20,(int *)((long)&st_local + 4));
  }
  if (((_a[1].file_count & 0x10U) == 0) &&
     (linkbuffer_len._4_4_ =
           setup_xattrs((archive_read_disk *)_a,paStack_20,(int *)((long)&st_local + 4)),
     linkbuffer_len._4_4_ < stflags)) {
    stflags = linkbuffer_len._4_4_;
  }
  if (((_a[1].file_count & 4U) != 0) &&
     (linkbuffer_len._4_4_ =
           setup_mac_metadata((archive_read_disk *)_a,paStack_20,(int *)((long)&st_local + 4)),
     linkbuffer_len._4_4_ < stflags)) {
    stflags = linkbuffer_len._4_4_;
  }
  linkbuffer_len._4_4_ =
       setup_sparse((archive_read_disk *)_a,paStack_20,(int *)((long)&st_local + 4));
  if (linkbuffer_len._4_4_ < stflags) {
    stflags = linkbuffer_len._4_4_;
  }
  if (r1 != st_local._4_4_) {
    close(st_local._4_4_);
  }
  return stflags;
}

Assistant:

int
archive_read_disk_entry_from_file(struct archive *_a,
    struct archive_entry *entry,
    int fd,
    const struct stat *st)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	const char *path, *name;
	struct stat s;
	int initial_fd = fd;
	int r, r1;

	archive_clear_error(_a);
	path = archive_entry_sourcepath(entry);
	if (path == NULL)
		path = archive_entry_pathname(entry);

	if (a->tree == NULL) {
		if (st == NULL) {
#if HAVE_FSTAT
			if (fd >= 0) {
				if (fstat(fd, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't fstat");
					return (ARCHIVE_FAILED);
				}
			} else
#endif
#if HAVE_LSTAT
			if (!a->follow_symlinks) {
				if (lstat(path, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't lstat %s", path);
					return (ARCHIVE_FAILED);
				}
			} else
#endif
			if (stat(path, &s) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't stat %s", path);
				return (ARCHIVE_FAILED);
			}
			st = &s;
		}
		archive_entry_copy_stat(entry, st);
	}

	/* Lookup uname/gname */
	name = archive_read_disk_uname(_a, archive_entry_uid(entry));
	if (name != NULL)
		archive_entry_copy_uname(entry, name);
	name = archive_read_disk_gname(_a, archive_entry_gid(entry));
	if (name != NULL)
		archive_entry_copy_gname(entry, name);

#ifdef HAVE_STRUCT_STAT_ST_FLAGS
	/* On FreeBSD, we get flags for free with the stat. */
	/* TODO: Does this belong in copy_stat()? */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 && st->st_flags != 0)
		archive_entry_set_fflags(entry, st->st_flags, 0);
#endif

#if (defined(FS_IOC_GETFLAGS) && defined(HAVE_WORKING_FS_IOC_GETFLAGS)) || \
    (defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS))
	/* Linux requires an extra ioctl to pull the flags.  Although
	 * this is an extra step, it has a nice side-effect: We get an
	 * open file descriptor which we can use in the subsequent lookups. */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 &&
	    (S_ISREG(st->st_mode) || S_ISDIR(st->st_mode))) {
		if (fd < 0) {
			if (a->tree != NULL)
				fd = a->open_on_current_dir(a->tree, path,
					O_RDONLY | O_NONBLOCK | O_CLOEXEC);
			else
				fd = open(path, O_RDONLY | O_NONBLOCK |
						O_CLOEXEC);
			__archive_ensure_cloexec_flag(fd);
		}
		if (fd >= 0) {
			int stflags;
			r = ioctl(fd,
#if defined(FS_IOC_GETFLAGS)
			    FS_IOC_GETFLAGS,
#else
			    EXT2_IOC_GETFLAGS,
#endif
			    &stflags);
			if (r == 0 && stflags != 0)
				archive_entry_set_fflags(entry, stflags, 0);
		}
	}
#endif

#if defined(HAVE_READLINK) || defined(HAVE_READLINKAT)
	if (S_ISLNK(st->st_mode)) {
		size_t linkbuffer_len = st->st_size + 1;
		char *linkbuffer;
		int lnklen;

		linkbuffer = malloc(linkbuffer_len);
		if (linkbuffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't read link data");
			return (ARCHIVE_FAILED);
		}
		if (a->tree != NULL) {
#ifdef HAVE_READLINKAT
			lnklen = readlinkat(a->tree_current_dir_fd(a->tree),
			    path, linkbuffer, linkbuffer_len);
#else
			if (a->tree_enter_working_dir(a->tree) != 0) {
				archive_set_error(&a->archive, errno,
				    "Couldn't read link data");
				free(linkbuffer);
				return (ARCHIVE_FAILED);
			}
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
#endif /* HAVE_READLINKAT */
		} else
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
		if (lnklen < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't read link data");
			free(linkbuffer);
			return (ARCHIVE_FAILED);
		}
		linkbuffer[lnklen] = 0;
		archive_entry_set_symlink(entry, linkbuffer);
		free(linkbuffer);
	}
#endif /* HAVE_READLINK || HAVE_READLINKAT */

	r = 0;
	if ((a->flags & ARCHIVE_READDISK_NO_ACL) == 0)
		r = archive_read_disk_entry_setup_acls(a, entry, &fd);
	if ((a->flags & ARCHIVE_READDISK_NO_XATTR) == 0) {
		r1 = setup_xattrs(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if (a->flags & ARCHIVE_READDISK_MAC_COPYFILE) {
		r1 = setup_mac_metadata(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	r1 = setup_sparse(a, entry, &fd);
	if (r1 < r)
		r = r1;

	/* If we opened the file earlier in this function, close it. */
	if (initial_fd != fd)
		close(fd);
	return (r);
}